

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

int qSmartSpacing(QLayout *layout,PixelMetric pm)

{
  QWidget *this;
  int iVar1;
  QStyle *pQVar2;
  
  this = *(QWidget **)(*(long *)&layout->field_0x8 + 0x10);
  if (this == (QWidget *)0x0) {
    return -1;
  }
  if ((*(byte *)(*(long *)&this->field_0x8 + 0x30) & 1) == 0) {
    iVar1 = (**(code **)(*(long *)this + 0x60))(this);
    return iVar1;
  }
  pQVar2 = QWidget::style(this);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,pm,0,this,*(code **)(*(long *)pQVar2 + 0xe0))
  ;
  return iVar1;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }